

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  char_type buffer [26];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  char local_48 [32];
  
  local_58._M_stream = it->_M_stream;
  local_58._M_string = it->_M_string;
  uVar6 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  lVar9 = (long)iVar1;
  pcVar7 = local_48 + lVar9;
  if (uVar6 < 100) {
    if (uVar6 < 10) goto LAB_001e81d3;
    uVar6 = (ulong)(uint)((int)uVar6 * 2);
    local_48[lVar9 + -1] = internal::basic_data<void>::DIGITS[uVar6 + 1];
LAB_001e81e9:
    pcVar7 = pcVar7 + -1;
  }
  else {
    iVar8 = 0;
    do {
      uVar5 = uVar6;
      uVar6 = uVar5 / 100;
      uVar2 = (ulong)(uint)(((int)uVar5 + (int)uVar6 * -100) * 2);
      pcVar7[-1] = internal::basic_data<void>::DIGITS[uVar2 + 1];
      if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(num_writer *)(pcVar7 + -2) = this[0xc];
        pcVar7[-3] = internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar3 = -4;
          goto LAB_001e8181;
        }
        pcVar7 = pcVar7 + -3;
      }
      else {
        pcVar7[-2] = internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar3 = -3;
LAB_001e8181:
          *(num_writer *)(pcVar7 + lVar3) = this[0xc];
          pcVar7 = pcVar7 + lVar3;
        }
        else {
          pcVar7 = pcVar7 + -2;
        }
      }
      iVar8 = iVar8 + 2;
    } while (9999 < uVar5);
    if (uVar5 < 1000) {
LAB_001e81d3:
      bVar4 = (byte)uVar6 | 0x30;
      goto LAB_001e81f8;
    }
    uVar6 = (ulong)(uint)((int)uVar6 * 2);
    pcVar7[-1] = internal::basic_data<void>::DIGITS[uVar6 + 1];
    if (0x55555555 < iVar8 * -0x55555555 + 0xaaaaaaabU) goto LAB_001e81e9;
    *(num_writer *)(pcVar7 + -2) = this[0xc];
    pcVar7 = pcVar7 + -2;
  }
  bVar4 = internal::basic_data<void>::DIGITS[uVar6];
LAB_001e81f8:
  pcVar7[-1] = bVar4;
  if (0 < iVar1) {
    pcVar7 = local_48;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,pcVar7);
      pcVar7 = pcVar7 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  it->_M_stream = local_58._M_stream;
  it->_M_string = local_58._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }